

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

int fmt::v10::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  byte *pbVar7;
  
  pbVar1 = (byte *)*begin;
  if ((pbVar1 == (byte *)end) || (bVar6 = *pbVar1, 9 < (byte)(bVar6 - 0x30))) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                ,0x87e,"");
  }
  uVar3 = 0;
  pbVar7 = pbVar1;
  do {
    pbVar2 = pbVar7;
    pbVar7 = pbVar2 + 1;
    uVar5 = (ulong)uVar3;
    uVar3 = ((uint)bVar6 + uVar3 * 10) - 0x30;
    pbVar4 = (byte *)end;
    if (pbVar7 == (byte *)end) break;
    bVar6 = *pbVar7;
    pbVar4 = pbVar7;
  } while ((byte)(bVar6 - 0x30) < 10);
  *begin = (char *)pbVar4;
  if ((9 < (long)pbVar4 - (long)pbVar1) &&
     (((long)pbVar4 - (long)pbVar1 != 10 ||
      (((ulong)((int)(char)*pbVar2 - 0x30U & 0xfffffffe) + uVar5 * 10 & 0xffffffff80000000) != 0))))
  {
    uVar3 = error_value;
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}